

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmDbcc<(moira::Instr)46,(moira::Mode)12,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  char *pcVar2;
  byte *pbVar3;
  u32 uVar4;
  StrWriter *this_00;
  
  uVar1 = *addr;
  uVar4 = dasmRead<(moira::Size)2>(this,addr);
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Align)(this->tab).raw);
  pcVar2 = this_00->ptr;
  this_00->ptr = pcVar2 + 1;
  *pcVar2 = 'D';
  pbVar3 = (byte *)this_00->ptr;
  this_00->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)op & 7 | 0x30;
  StrWriter::operator<<(this_00,", ");
  StrWriter::operator<<(this_00,(UInt)(uVar1 + (int)(short)uVar4 + 2));
  return;
}

Assistant:

void
Moira::dasmDbcc(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Dn ( _____________xxx(op) );
    auto dst = addr + 2;

    dst += (i16)dasmRead<Word>(addr);

    str << Ins<I>{} << tab << src << ", " << UInt(dst);
}